

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  WritableFile WVar1;
  int fd;
  int *piVar2;
  long in_RSI;
  undefined1 auVar3 [8];
  Status status;
  undefined1 local_38 [8];
  WritableFile local_30;
  
  if (*(char *)(in_RSI + 0x10014) == '\x01') {
    fd = open(*(char **)(in_RSI + 0x10038),0x80000);
    if (fd < 0) {
      piVar2 = __errno_location();
      PosixError((anon_unknown_1 *)local_38,(string *)(in_RSI + 0x10038),*piVar2);
      auVar3 = local_38;
      local_38 = (undefined1  [8])0x0;
      Status::~Status((Status *)local_38);
    }
    else {
      SyncFd((PosixWritableFile *)local_38,fd,(string *)(in_RSI + 0x10038));
      auVar3 = local_38;
      local_38 = (undefined1  [8])0x0;
      Status::~Status((Status *)local_38);
      close(fd);
    }
    if (auVar3 == (undefined1  [8])0x0) goto LAB_0014028d;
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)auVar3;
  }
  else {
LAB_0014028d:
    FlushBuffer((PosixWritableFile *)&stack0xffffffffffffffd0);
    WVar1._vptr_WritableFile = local_30._vptr_WritableFile;
    local_38 = (undefined1  [8])local_30._vptr_WritableFile;
    local_30._vptr_WritableFile = (_func_int **)0x0;
    Status::~Status((Status *)&stack0xffffffffffffffd0);
    if (WVar1._vptr_WritableFile == (_func_int **)0x0) {
      SyncFd(this,*(int *)(in_RSI + 0x10010),(string *)(in_RSI + 0x10018));
      goto LAB_001402d8;
    }
    (this->super_WritableFile)._vptr_WritableFile = WVar1._vptr_WritableFile;
  }
  local_38 = (undefined1  [8])0x0;
LAB_001402d8:
  Status::~Status((Status *)local_38);
  return (Status)(char *)this;
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_);
  }